

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

bool __thiscall spirv_cross::CompilerMSL::is_patch_block(CompilerMSL *this,SPIRType *type)

{
  bool bVar1;
  TypedID<(spirv_cross::Types)1> id;
  size_t sVar2;
  uint local_28;
  uint32_t i;
  SPIRType *type_local;
  CompilerMSL *this_local;
  
  bVar1 = Compiler::has_decoration
                    ((Compiler *)this,(ID)(type->super_IVariant).self.id,DecorationBlock);
  if (bVar1) {
    for (local_28 = 0;
        sVar2 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::size
                          (&(type->member_types).
                            super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>),
        local_28 < sVar2; local_28 = local_28 + 1) {
      id = TypedID::operator_cast_to_TypedID((TypedID *)&(type->super_IVariant).self);
      bVar1 = Compiler::has_member_decoration
                        ((Compiler *)this,(TypeID)id.id,local_28,DecorationPatch);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        return false;
      }
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool CompilerMSL::is_patch_block(const SPIRType &type)
{
	if (!has_decoration(type.self, DecorationBlock))
		return false;

	for (uint32_t i = 0; i < type.member_types.size(); i++)
	{
		if (!has_member_decoration(type.self, i, DecorationPatch))
			return false;
	}

	return true;
}